

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamAttribute::QXmlStreamAttribute
          (QXmlStreamAttribute *this,QString *qualifiedName,QString *value)

{
  qsizetype n;
  QXmlString *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qsizetype colon;
  undefined4 in_stack_ffffffffffffff68;
  CaseSensitivity in_stack_ffffffffffffff6c;
  QString *in_stack_ffffffffffffff78;
  QChar ch;
  qsizetype in_stack_ffffffffffffffb0;
  QString *in_stack_ffffffffffffffb8;
  QChar local_a;
  long local_8;
  
  ch.ucs = (char16_t)((ulong)in_RDI >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::QXmlString::QXmlString((QXmlString *)0x64b072);
  QtPrivate::QXmlString::QXmlString((QXmlString *)0x64b085);
  QtPrivate::QXmlString::QXmlString((QXmlString *)0x64b09a);
  QtPrivate::QXmlString::QXmlString((QXmlString *)0x64b0af);
  QChar::QChar<char16_t,_true>(&local_a,L':');
  n = QString::indexOf(in_stack_ffffffffffffff78,ch,(qsizetype)in_RSI,in_stack_ffffffffffffff6c);
  QString::mid(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,n);
  QtPrivate::QXmlString::operator=
            (in_RSI,(QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QString::~QString((QString *)0x64b134);
  QtPrivate::QXmlString::operator=
            (in_RSI,(QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QtPrivate::QXmlString::operator=
            (in_RSI,(QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamAttribute::QXmlStreamAttribute(const QString &qualifiedName, const QString &value)
{
    qsizetype colon = qualifiedName.indexOf(u':');
    m_name = qualifiedName.mid(colon + 1);
    m_qualifiedName = qualifiedName;
    m_value = value;
}